

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

ExpirableObject ** __thiscall
DListBase<ExpirableObject_*,_RealCount>::PrependNode<Memory::ArenaAllocator>
          (DListBase<ExpirableObject_*,_RealCount> *this,ArenaAllocator *allocator)

{
  DListNodeBase<ExpirableObject_*> *pDVar1;
  DListNodeBase<ExpirableObject_*> *pDVar2;
  
  pDVar2 = (DListNodeBase<ExpirableObject_*> *)new<Memory::ArenaAllocator>(0x18,allocator,0x35916e);
  pDVar2[1].next.base = (DListNodeBase<ExpirableObject_*> *)0x0;
  pDVar1 = (this->super_DListNodeBase<ExpirableObject_*>).next.base;
  pDVar2->prev = pDVar1->prev;
  (pDVar2->next).base = pDVar1;
  *(DListNodeBase<ExpirableObject_*> **)pDVar1->prev = pDVar2;
  (pDVar1->prev).base = pDVar2;
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return (ExpirableObject **)(pDVar2 + 1);
}

Assistant:

TData * PrependNode(TAllocator * allocator)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }